

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcFormalTypeList::add(CTcFormalTypeList *this,CTcFormalTypeEle *ele)

{
  CTcFormalTypeEle *ele_local;
  CTcFormalTypeList *this_local;
  
  if (this->tail_ == (CTcFormalTypeEle *)0x0) {
    this->head_ = ele;
  }
  else {
    this->tail_->nxt_ = ele;
  }
  this->tail_ = ele;
  ele->nxt_ = (CTcFormalTypeEle *)0x0;
  return;
}

Assistant:

void CTcFormalTypeList::add(CTcFormalTypeEle *ele)
{
    /* link it into our list */
    if (tail_ != 0)
        tail_->nxt_ = ele;
    else
        head_ = ele;
    tail_ = ele;
    ele->nxt_ = 0;
}